

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::UniformGridMediumProvider::GetMaxDensityGrid
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          UniformGridMediumProvider *this,Allocator alloc,Point3i *res)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001384 [12];
  Bounds3f bounds;
  float local_9c;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined4 local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  (res->super_Tuple3<pbrt::Point3,_int>).x = 0x10;
  (res->super_Tuple3<pbrt::Point3,_int>).y = 0x10;
  (res->super_Tuple3<pbrt::Point3,_int>).z = 0x10;
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->ptr = (float *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  __return_storage_ptr__->nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
            (__return_storage_ptr__,0x1000);
  if (0 < (res->super_Tuple3<pbrt::Point3,_int>).z) {
    lVar4 = 0;
    local_9c = 0.0;
    do {
      if (0 < (res->super_Tuple3<pbrt::Point3,_int>).y) {
        fVar5 = 0.0;
        do {
          iVar1 = (res->super_Tuple3<pbrt::Point3,_int>).x;
          if (0 < iVar1) {
            auVar6._0_4_ = (float)iVar1;
            auVar6._4_12_ = in_register_00001384;
            local_58 = ZEXT416((uint)(fVar5 + 1.0));
            lVar4 = (long)(int)lVar4;
            local_48 = ZEXT816(0);
            do {
              auVar9._0_4_ = (float)(res->super_Tuple3<pbrt::Point3,_int>).y;
              auVar9._4_12_ = in_register_00001384;
              auVar9 = vinsertps_avx(auVar6,auVar9,0x10);
              fVar8 = (float)(res->super_Tuple3<pbrt::Point3,_int>).z;
              auVar10._0_4_ = local_9c / fVar8;
              auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar6 = vinsertps_avx(local_48,ZEXT416((uint)fVar5),0x10);
              auVar7._0_4_ = (local_9c + 1.0) / fVar8;
              auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar6 = vdivps_avx(auVar6,auVar9);
              local_48 = ZEXT416((uint)(local_48._0_4_ + 1.0));
              auVar2 = vinsertps_avx(local_48,ZEXT416((uint)local_58._0_4_),0x10);
              auVar9 = vdivps_avx(auVar2,auVar9);
              auVar2 = vminps_avx(auVar9,auVar6);
              auVar3 = vminss_avx(auVar7,auVar10);
              local_70 = vmovlps_avx(auVar2);
              local_68 = auVar3._0_4_;
              auVar6 = vmaxps_avx(auVar9,auVar6);
              auVar9 = vmaxss_avx(auVar7,auVar10);
              local_64 = vmovlps_avx(auVar6);
              local_5c = auVar9._0_4_;
              if ((this->densityGrid).set == true) {
                fVar8 = SampledGrid<float>::
                        MaxValue<pbrt::SampledGrid<float>::MaxValue(pbrt::Bounds3<float>const&)const::_lambda(float)_1_>
                                  ((SampledGrid<float> *)&this->densityGrid,&local_70);
              }
              else {
                if ((this->rgbDensityGrid).set == false) {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                             ,0xef,"Check failed: %s",(char (*) [4])0x287813c);
                }
                fVar8 = SampledGrid<pbrt::RGBUnboundedSpectrum>::operator()
                                  ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)&this->rgbDensityGrid,
                                   &local_70);
              }
              __return_storage_ptr__->ptr[lVar4] = fVar8;
              lVar4 = lVar4 + 1;
              auVar6._0_4_ = (float)(res->super_Tuple3<pbrt::Point3,_int>).x;
              auVar6._4_12_ = in_register_00001384;
            } while (local_48._0_4_ < auVar6._0_4_);
          }
          fVar5 = fVar5 + 1.0;
        } while (fVar5 < (float)(res->super_Tuple3<pbrt::Point3,_int>).y);
      }
      local_9c = local_9c + 1.0;
    } while (local_9c < (float)(res->super_Tuple3<pbrt::Point3,_int>).z);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
        // Set _gridResolution_ and allocate _maxGrid_
        *res = Point3i(16, 16, 16);
        pstd::vector<Float> maxGrid(alloc);
        maxGrid.resize(res->x * res->y * res->z);

        // Define _getMaxDensity_ lambda
        auto getMaxDensity = [&](const Bounds3f &bounds) -> Float {
            if (densityGrid)
                return densityGrid->MaxValue(bounds);
            else
                return rgbDensityGrid->MaxValue(
                    bounds,
                    [] PBRT_CPU_GPU(RGBUnboundedSpectrum s) { return s.MaxValue(); });
        };

        // Compute maximum density for each _maxGrid_ cell
        int offset = 0;
        for (Float z = 0; z < res->z; ++z)
            for (Float y = 0; y < res->y; ++y)
                for (Float x = 0; x < res->x; ++x) {
                    Bounds3f bounds(
                        Point3f(x / res->x, y / res->y, z / res->z),
                        Point3f((x + 1) / res->x, (y + 1) / res->y, (z + 1) / res->z));
                    maxGrid[offset++] = getMaxDensity(bounds);
                }

        return maxGrid;
    }